

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistent_cohomology.h
# Opt level: O3

void __thiscall
Gudhi::persistent_cohomology::
Persistent_cohomology<Gudhi::cubical_complex::Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>,_Gudhi::persistent_cohomology::Field_Zp>
::update_cohomology_groups
          (Persistent_cohomology<Gudhi::cubical_complex::Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>,_Gudhi::persistent_cohomology::Field_Zp>
           *this,Simplex_handle sigma,int dim_sigma)

{
  _Rb_tree_header *p_Var1;
  int inv_x;
  pair<unsigned_long,_int> *ppVar2;
  _Base_ptr p_Var3;
  pair<unsigned_long,_int> *ppVar4;
  int charac;
  __normal_iterator<std::pair<unsigned_long,_int>_*,_std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>_>
  __tmp;
  pointer ppVar5;
  A_ds_type a_ds;
  map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
  map_a_ds;
  A_ds_type local_88;
  pair<unsigned_long,_int> local_70;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_int>,_std::_Select1st<std::pair<const_unsigned_long,_int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
  local_60;
  
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  annotation_of_the_boundary
            (this,(map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
                   *)&local_60,sigma,dim_sigma);
  if (local_60._M_impl.super__Rb_tree_header._M_node_count == 0) {
    if (dim_sigma < this->dim_max_) {
      create_cocycle(this,sigma,1,(this->coeff_field_).Prime);
    }
  }
  else {
    local_88.
    super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pair<unsigned_long,_int> *)0x0;
    local_88.
    super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pair<unsigned_long,_int> *)0x0;
    local_88.
    super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pair<unsigned_long,_int> *)0x0;
    if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left == p_Var1) {
      charac = (this->coeff_field_).Prime;
      ppVar4 = (pair<unsigned_long,_int> *)0x0;
    }
    else {
      p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        local_70.first = *(unsigned_long *)(p_Var3 + 1);
        local_70.second = *(int *)&p_Var3[1]._M_parent;
        if (local_88.
            super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_88.
            super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<std::pair<unsigned_long,int>,std::allocator<std::pair<unsigned_long,int>>>::
          _M_realloc_insert<std::pair<unsigned_long,int>>
                    ((vector<std::pair<unsigned_long,int>,std::allocator<std::pair<unsigned_long,int>>>
                      *)&local_88,
                     (iterator)
                     local_88.
                     super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_70);
        }
        else {
          (local_88.
           super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->first = local_70.first;
          *(ulong *)&(local_88.
                      super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->second =
               CONCAT44(local_70._12_4_,local_70.second);
          local_88.
          super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_88.
               super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      } while ((_Rb_tree_header *)p_Var3 != p_Var1);
      charac = (this->coeff_field_).Prime;
      ppVar4 = local_88.
               super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (local_88.
          super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_88.
          super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        ppVar5 = local_88.
                 super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        do {
          if (charac == 1) goto LAB_00107303;
          ppVar2 = ppVar5 + -1;
          ppVar5 = ppVar5 + -1;
          inv_x = (this->coeff_field_).inverse_.super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_start[ppVar2->second];
          if (inv_x != 0) {
            destroy_cocycle(this,sigma,&local_88,ppVar5->first,inv_x,charac);
            charac = 1;
            ppVar4 = local_88.
                     super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          }
        } while (ppVar5 != ppVar4);
      }
    }
    if ((charac != 1) && (dim_sigma < this->dim_max_)) {
      create_cocycle(this,sigma,1,charac);
      ppVar4 = local_88.
               super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
LAB_00107303:
    if (ppVar4 != (pair<unsigned_long,_int> *)0x0) {
      operator_delete(ppVar4,(long)local_88.
                                   super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVar4
                     );
    }
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_int>,_std::_Select1st<std::pair<const_unsigned_long,_int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void update_cohomology_groups(Simplex_handle sigma, int dim_sigma) {
// Compute the annotation of the boundary of sigma:
    std::map<Simplex_key, Arith_element> map_a_ds;
    annotation_of_the_boundary(map_a_ds, sigma, dim_sigma);
// Update the cohomology groups:
    if (map_a_ds.empty()) {  // sigma is a creator in all fields represented in coeff_field_
      if (dim_sigma < dim_max_) {
        create_cocycle(sigma, coeff_field_.multiplicative_identity(),
                       coeff_field_.characteristic());
      }
    } else {        // sigma is a destructor in at least a field in coeff_field_
      // Convert map_a_ds to a vector
      A_ds_type a_ds;  // admits reverse iterators
      for (auto map_a_ds_ref : map_a_ds) {
        a_ds.push_back(
            std::pair<Simplex_key, Arith_element>(map_a_ds_ref.first,
                                                  map_a_ds_ref.second));
      }

      Arith_element inv_x, charac;
      Arith_element prod = coeff_field_.characteristic();  // Product of characteristic of the fields
      for (auto a_ds_rit = a_ds.rbegin();
          (a_ds_rit != a_ds.rend())
              && (prod != coeff_field_.multiplicative_identity()); ++a_ds_rit) {
        std::tie(inv_x, charac) = coeff_field_.inverse(a_ds_rit->second, prod);

        if (inv_x != coeff_field_.additive_identity()) {
          destroy_cocycle(sigma, a_ds, a_ds_rit->first, inv_x, charac);
          prod /= charac;
        }
      }
      if (prod != coeff_field_.multiplicative_identity()
          && dim_sigma < dim_max_) {
        create_cocycle(sigma, coeff_field_.multiplicative_identity(prod), prod);
      }
    }
  }